

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O2

void __thiscall scheduler_tests::wait_until_past::test_method(wait_until_past *this)

{
  long lVar1;
  cv_status cVar2;
  iterator pvVar3;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar5;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  lazy_ostream local_118;
  undefined1 *local_108;
  char **local_100;
  seconds local_f8;
  assertion_result local_f0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  anon_class_16_2_5c76cbfd no_wait;
  Mutex mtx;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  condition_variable condvar;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::condition_variable::condition_variable(&condvar);
  mtx.super_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mtx.super_mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mtx.super_mutex.super___mutex_base._M_mutex.__align = 0;
  mtx.super_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  mtx.super_mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  pvVar3 = (iterator)0x71;
  pvVar4 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&lock,&mtx,"mtx",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
             ,0x71,false);
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x77;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = pvVar4;
  msg.m_begin = pvVar3;
  no_wait.condvar = &condvar;
  no_wait.lock = &lock;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  local_f8.__r = 1;
  cVar2 = test_method::anon_class_16_2_5c76cbfd::operator()(&no_wait,&local_f8);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar2 == timeout);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128 = "std::cv_status::timeout == no_wait(std::chrono::seconds{1})";
  local_120 = "";
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_130 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_100 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_118,1,0,WARN,_cVar5,(size_t)&local_138,0x77);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x78;
  file_00.m_begin = (iterator)&local_148;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_158,
             msg_00);
  local_f8.__r = 0x3c;
  cVar2 = test_method::anon_class_16_2_5c76cbfd::operator()(&no_wait,&local_f8);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar2 == timeout);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128 = "std::cv_status::timeout == no_wait(std::chrono::minutes{1})";
  local_120 = "";
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_160 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_100 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_118,1,0,WARN,_cVar5,(size_t)&local_168,0x78);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x79;
  file_01.m_begin = (iterator)&local_178;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_188,
             msg_01);
  local_f8.__r = 0xe10;
  cVar2 = test_method::anon_class_16_2_5c76cbfd::operator()(&no_wait,&local_f8);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar2 == timeout);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128 = "std::cv_status::timeout == no_wait(std::chrono::hours{1})";
  local_120 = "";
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_190 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_100 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_118,1,0,WARN,_cVar5,(size_t)&local_198,0x79);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x7a;
  file_02.m_begin = (iterator)&local_1a8;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b8,
             msg_02);
  local_f8.__r = 36000;
  cVar2 = test_method::anon_class_16_2_5c76cbfd::operator()(&no_wait,&local_f8);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar2 == timeout);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128 = "std::cv_status::timeout == no_wait(std::chrono::hours{10})";
  local_120 = "";
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1c0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_100 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_118,1,0,WARN,_cVar5,(size_t)&local_1c8,0x7a);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x7b;
  file_03.m_begin = (iterator)&local_1d8;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e8,
             msg_03);
  local_f8.__r = 360000;
  cVar2 = test_method::anon_class_16_2_5c76cbfd::operator()(&no_wait,&local_f8);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar2 == timeout);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128 = "std::cv_status::timeout == no_wait(std::chrono::hours{100})";
  local_120 = "";
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1f0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_100 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_118,1,0,WARN,_cVar5,(size_t)&local_1f8,0x7b);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x7c;
  file_04.m_begin = (iterator)&local_208;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_218,
             msg_04);
  local_f8.__r = 3600000;
  cVar2 = test_method::anon_class_16_2_5c76cbfd::operator()(&no_wait,&local_f8);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar2 == timeout);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128 = "std::cv_status::timeout == no_wait(std::chrono::hours{1000})";
  local_120 = "";
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_220 = "";
  local_100 = &local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_118,1,0,WARN,_cVar5,(size_t)&local_228,0x7c);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  std::unique_lock<std::mutex>::~unique_lock(&lock.super_unique_lock);
  std::condition_variable::~condition_variable(&condvar);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(wait_until_past)
{
    std::condition_variable condvar;
    Mutex mtx;
    WAIT_LOCK(mtx, lock);

    const auto no_wait = [&](const std::chrono::seconds& d) {
        return condvar.wait_until(lock, std::chrono::steady_clock::now() - d);
    };

    BOOST_CHECK(std::cv_status::timeout == no_wait(std::chrono::seconds{1}));
    BOOST_CHECK(std::cv_status::timeout == no_wait(std::chrono::minutes{1}));
    BOOST_CHECK(std::cv_status::timeout == no_wait(std::chrono::hours{1}));
    BOOST_CHECK(std::cv_status::timeout == no_wait(std::chrono::hours{10}));
    BOOST_CHECK(std::cv_status::timeout == no_wait(std::chrono::hours{100}));
    BOOST_CHECK(std::cv_status::timeout == no_wait(std::chrono::hours{1000}));
}